

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_writer.h
# Opt level: O2

OutputWriter * __thiscall
uttamarin::OutputWriter::WriteColorized<char_const*>(OutputWriter *this,char *input,TextColor color)

{
  pointer ppbVar1;
  pointer ppbVar2;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2;
  
  ppbVar1 = (this->streams_).
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppbVar2 = (this->streams_).
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppbVar2 != ppbVar1;
      ppbVar2 = ppbVar2 + 1) {
    if ((ostream *)*ppbVar2 == (ostream *)&std::cout) {
      WriteColorized<char_const*>(this,(ostream *)&std::cout,input,color);
    }
    else {
      std::operator<<((ostream *)*ppbVar2,input);
    }
  }
  return this;
}

Assistant:

OutputWriter& OutputWriter::WriteColorized(T input, TextColor color) {
  for(auto stream : streams_){
    if(stream == &std::cout) WriteColorized(*stream, input, color);
    else *stream << input;
  }
  return *this;
}